

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_mpi_mul_mod(mbedtls_ecp_group *grp,mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t sVar2;
  mbedtls_mpi *Y;
  
  iVar1 = mbedtls_mpi_mul_mpi(X,A,B);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (grp->modp == (_func_int_mbedtls_mpi_ptr *)0x0) {
    iVar1 = mbedtls_mpi_mod_mpi(X,X,&grp->P);
    return iVar1;
  }
  if ((X->s < 0) && (iVar1 = mbedtls_mpi_cmp_int(X,0), iVar1 != 0)) {
    return -0x4f80;
  }
  sVar2 = mbedtls_mpi_bitlen(X);
  if (grp->pbits * 2 < sVar2) {
    return -0x4f80;
  }
  iVar1 = (*grp->modp)(X);
  if (iVar1 != 0) {
    return iVar1;
  }
  Y = &grp->P;
  while ((X->s < 0 && (iVar1 = mbedtls_mpi_cmp_int(X,0), iVar1 != 0))) {
    iVar1 = mbedtls_mpi_add_mpi(X,X,Y);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  do {
    iVar1 = mbedtls_mpi_cmp_mpi(X,Y);
    if (iVar1 < 0) {
      return 0;
    }
    iVar1 = mbedtls_mpi_sub_abs(X,X,Y);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

static inline int mbedtls_mpi_mul_mod(const mbedtls_ecp_group *grp,
                                      mbedtls_mpi *X,
                                      const mbedtls_mpi *A,
                                      const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(X, A, B));
    MOD_MUL(*X);
cleanup:
    return ret;
}